

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FSAOHDist_NECOF.cpp
# Opt level: O0

double __thiscall
FSAOHDist_NECOF::GetOHProb_relT
          (FSAOHDist_NECOF *this,Scope *agSc,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *ohI)

{
  ulong __n;
  size_type sVar1;
  const_reference pvVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  double p_this_agent;
  Index ohI_agI;
  Index agI;
  Index i;
  double p;
  undefined4 local_24;
  undefined8 local_20;
  
  local_20 = 1.0;
  local_24 = 0;
  while( true ) {
    __n = (ulong)local_24;
    sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(in_RSI);
    if (sVar1 <= __n) break;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI,__n);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_RDI,__n);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::at((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *)in_RDI,__n);
    pvVar2 = std::vector<double,_std::allocator<double>_>::at(in_RDI,__n);
    local_20 = *pvVar2 * local_20;
    local_24 = local_24 + 1;
  }
  return local_20;
}

Assistant:

double FSAOHDist_NECOF::GetOHProb_relT(
        const Scope& agSc, 
        const std::vector<Index>& ohI)
    const
{
    double p = 1.0;
    for(Index i=0; i < agSc.size(); i++)
    {
        Index agI = agSc.at(i);
        Index ohI_agI = ohI.at(i);
        double p_this_agent = _m_oHistMarginals.at(agI).at(ohI_agI);
        p *= p_this_agent;
    }
    return p;
}